

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMap.cpp
# Opt level: O1

Iterator __thiscall Js::JavascriptMap::GetIterator(JavascriptMap *this)

{
  Type extraout_RDX;
  long in_RSI;
  Iterator IVar1;
  
  Memory::Recycler::WBSetBit((char *)this);
  (this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)(in_RSI + 0x20);
  Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
  (this->super_DynamicObject).super_RecyclableObject.type.ptr = (Type *)0x0;
  IVar1.current.ptr = extraout_RDX.ptr;
  IVar1.list.ptr =
       (MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
        *)this;
  return IVar1;
}

Assistant:

JavascriptMap::MapDataList::Iterator JavascriptMap::GetIterator()
{
    return list.GetIterator();
}